

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O3

PLTermBuilder __thiscall
mp::BasicExprFactory<std::allocator<char>_>::BeginPLTerm
          (BasicExprFactory<std::allocator<char>_> *this,int num_breakpoints)

{
  uint uVar1;
  undefined8 *puVar2;
  PLTermBuilder PVar3;
  
  uVar1 = -num_breakpoints;
  if (0 < num_breakpoints) {
    uVar1 = num_breakpoints;
  }
  if (uVar1 < 0x8000000) {
    PVar3.impl_ = Allocate<mp::PLTerm>(this,PLTERM,num_breakpoints << 4);
    (PVar3.impl_)->num_breakpoints = num_breakpoints;
    PVar3.slope_index_ = 0;
    PVar3.breakpoint_index_ = 0;
    return PVar3;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_00198898;
  __cxa_throw(puVar2,&OverflowError::typeinfo,std::exception::~exception);
}

Assistant:

PLTermBuilder BeginPLTerm(int num_breakpoints) {
    MP_ASSERT(num_breakpoints > 0, "invalid number of breakpoints");
    SafeInt<int> size = sizeof(double) * 2;
    PLTerm::Impl *impl = Allocate<PLTerm>(
          expr::PLTERM, val(size * num_breakpoints));
    impl->num_breakpoints = num_breakpoints;
    return PLTermBuilder(impl);
  }